

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ascon_hash.c
# Opt level: O0

void ascon_hash_xof_update(ascon_hash_ctx_t *ctx,uint8_t *data,size_t data_len)

{
  long in_RDI;
  uint8_t *in_stack_00000018;
  ascon_bufstate_t *in_stack_00000020;
  
  buffered_accumulation
            (in_stack_00000020,in_stack_00000018,(uint8_t *)ctx,(absorb_fptr)data,data_len,
             (uint8_t)((ulong)in_RDI >> 0x38));
  *(undefined1 *)(in_RDI + 0x39) = 2;
  return;
}

Assistant:

ASCON_API void
ascon_hash_xof_update(ascon_hash_ctx_t* const ctx,
                      const uint8_t* data,
                      size_t data_len)
{
    ASCON_ASSERT(ctx != NULL);
    ASCON_ASSERT(data_len == 0 || data != NULL);
    ASCON_ASSERT(ctx->flow_state == ASCON_FLOW_HASH_INITIALISED ||
                 ctx->flow_state == ASCON_FLOW_HASH_UPDATED);
    buffered_accumulation(ctx, NULL, data, absorb_hash_data, data_len, ASCON_RATE);
    ctx->flow_state = ASCON_FLOW_HASH_UPDATED;
}